

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

int __thiscall
ON_MappingTag::Compare
          (ON_MappingTag *this,ON_MappingTag *other,bool bCompareId,bool bCompareCRC,
          bool bCompareXform)

{
  int local_28;
  int rc;
  bool bCompareXform_local;
  bool bCompareCRC_local;
  bool bCompareId_local;
  ON_MappingTag *other_local;
  ON_MappingTag *this_local;
  
  local_28 = 0;
  if (bCompareId) {
    local_28 = ON_UuidCompare(&this->m_mapping_id,&other->m_mapping_id);
  }
  if ((local_28 == 0) && (bCompareCRC)) {
    if (this->m_mapping_crc < other->m_mapping_crc) {
      return -1;
    }
    if (other->m_mapping_crc < this->m_mapping_crc) {
      return 1;
    }
  }
  if ((local_28 == 0) && (bCompareXform)) {
    local_28 = ON_Xform::Compare(&this->m_mesh_xform,&other->m_mesh_xform);
  }
  return local_28;
}

Assistant:

int ON_MappingTag::Compare( 
             const ON_MappingTag& other,
             bool bCompareId,
             bool bCompareCRC,
             bool bCompareXform
             ) const
{
  int rc = 0;
  if ( !rc && bCompareId )
  {
    rc = ON_UuidCompare(m_mapping_id,other.m_mapping_id);
  }
  if ( !rc && bCompareCRC )
  {
    if (m_mapping_crc < other.m_mapping_crc)
      return -1;
    if (m_mapping_crc > other.m_mapping_crc)
      return 1;
  }
  if ( !rc && bCompareXform )
  {
    rc = m_mesh_xform.Compare(other.m_mesh_xform);
  }
  return rc;
}